

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix<Complex> __thiscall Matrix<Complex>::transposed(Matrix<Complex> *this)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Complex *extraout_RDX;
  Complex *pCVar5;
  long lVar6;
  uint *in_RSI;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  Matrix<Complex> MVar10;
  Complex *local_48;
  
  Matrix(this,in_RSI[1],*in_RSI);
  uVar3 = *in_RSI;
  pCVar5 = extraout_RDX;
  if (uVar3 != 0) {
    local_48 = (Complex *)0x0;
    uVar2 = in_RSI[1];
    do {
      uVar9 = (ulong)uVar2;
      uVar4 = 0;
      if (uVar2 != 0) {
        lVar6 = 0x40;
        uVar8 = 0;
        do {
          lVar1 = *(long *)(in_RSI + 2);
          uVar9 = (ulong)(uint)((int)uVar9 * (int)local_48);
          pCVar5 = this->arr +
                   (long)&(local_48->_re)._numerator.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start + (ulong)(this->N * (int)uVar8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pCVar5,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     (uVar9 * 0x80 + lVar1 + lVar6 + -0x40));
          lVar7 = uVar9 * 0x80 + lVar1 + lVar6;
          (pCVar5->_re)._numerator.negative = *(bool *)(lVar7 + -0x28);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (&(pCVar5->_re)._denominator.digits,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar7 + -0x20));
          lVar7 = uVar9 * 0x80 + lVar1;
          (pCVar5->_re)._denominator.negative = *(bool *)(lVar6 + -8 + lVar7);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pCVar5->_im,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar7 + lVar6));
          lVar7 = uVar9 * 0x80 + lVar1 + lVar6;
          (pCVar5->_im)._numerator.negative = *(bool *)(lVar7 + 0x18);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (&(pCVar5->_im)._denominator.digits,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar7 + 0x20));
          (pCVar5->_im)._denominator.negative = *(bool *)(lVar6 + 0x38 + lVar1 + uVar9 * 0x80);
          uVar8 = uVar8 + 1;
          uVar4 = in_RSI[1];
          uVar9 = (ulong)uVar4;
          lVar6 = lVar6 + 0x80;
        } while (uVar8 < uVar9);
        uVar3 = *in_RSI;
      }
      local_48 = (Complex *)
                 ((long)&(local_48->_re)._numerator.digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + 1);
      pCVar5 = (Complex *)(ulong)uVar3;
      uVar2 = uVar4;
    } while (local_48 < pCVar5);
  }
  MVar10.arr = pCVar5;
  MVar10._0_8_ = this;
  return MVar10;
}

Assistant:

const Matrix<Field> Matrix<Field>::transposed() const
{
    Matrix res(N, M);
    for(unsigned i = 0; i < M; ++i)
        for(unsigned j = 0; j < N; ++j)
        {
            res[j][i] = (*this)[i][j];
        }
    return res;
}